

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void check_integral_opt<int,zmq::sockopt::integral_option<27,int,false>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
               byte param_3)

{
  MessageBuilder *pMVar1;
  bool bVar2;
  Decomposer local_2bd;
  ExprLhs<int> local_2bc;
  enable_if_t<Detail::conjunction<Detail::is_eq_comparable<int,_int>,_capture_by_value<int>_>::value,_BinaryExpr<int,_int>_>
  local_2b8;
  StringRef local_290;
  SourceLineInfo local_280;
  StringRef local_270;
  undefined1 local_260 [8];
  AssertionHandler catchAssertionHandler;
  undefined1 local_210 [4];
  int s;
  SourceLineInfo local_1f0;
  StringRef local_1e0;
  MessageBuilder local_1d0;
  undefined1 local_178 [8];
  ScopedMessage scopedMessage18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  SourceLineInfo local_f0;
  StringRef local_e0;
  MessageBuilder local_d0;
  undefined1 local_78 [8];
  ScopedMessage scopedMessage17;
  int val;
  bool set_only_local;
  string *info_local;
  socket_t *sock_local;
  
  scopedMessage17._79_1_ = param_3 & 1;
  scopedMessage17.m_moved = true;
  scopedMessage17._73_3_ = 0;
  local_e0 = operator____catch_sr("INFO",4);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
             0xe5);
  Catch::MessageBuilder::MessageBuilder(&local_d0,local_e0,&local_f0,Info);
  std::operator+(&local_110,"setting ",param_2);
  pMVar1 = Catch::MessageBuilder::operator<<(&local_d0,&local_110);
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_78,pMVar1);
  std::__cxx11::string::~string((string *)&local_110);
  Catch::MessageBuilder::~MessageBuilder(&local_d0);
  zmq::detail::socket_base::set<27,int,false>(param_1,&scopedMessage17.m_moved);
  bVar2 = (scopedMessage17._79_1_ & 1) == 0;
  if (bVar2) {
    local_1e0 = operator____catch_sr("INFO",4);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
               0xea);
    Catch::MessageBuilder::MessageBuilder(&local_1d0,local_1e0,&local_1f0,Info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                   "getting ",param_2);
    pMVar1 = Catch::MessageBuilder::operator<<
                       (&local_1d0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_210);
    Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_178,pMVar1);
    std::__cxx11::string::~string((string *)local_210);
    Catch::MessageBuilder::~MessageBuilder(&local_1d0);
    catchAssertionHandler.m_resultCapture._4_4_ =
         zmq::detail::socket_base::get<27,int,false>(param_1);
    local_270 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
               0xec);
    local_290 = operator____catch_sr("s == val",8);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_260,local_270,&local_280,local_290,ContinueOnFailure);
    local_2bc = Catch::operator<=<int,_0>(&local_2bd,catchAssertionHandler.m_resultCapture._4_4_);
    Catch::operator==(&local_2b8,&local_2bc,1);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_260,&local_2b8.super_ITransientExpression);
    Catch::BinaryExpr<int,_int>::~BinaryExpr(&local_2b8);
    Catch::AssertionHandler::complete((AssertionHandler *)local_260);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_260);
    Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_178);
  }
  scopedMessage18._77_3_ = 0;
  scopedMessage18._76_1_ = !bVar2;
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_78);
  return;
}

Assistant:

void check_integral_opt(Opt opt,
                        zmq::socket_t &sock,
                        std::string info,
                        bool set_only = false)
{
    const T val = 1;
    INFO("setting " + info);
    sock.set(opt, val);
    if (set_only)
        return;

    INFO("getting " + info);
    auto s = sock.get(opt);
    CHECK(s == val);
}